

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O3

iterator_with_flag __thiscall
nestl::impl::detail::
rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
::m_insert_unique<nestl::has_exceptions::exception_ptr_error,int>
          (rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
           *this,exception_ptr_error *err,int *v)

{
  rb_tree_iterator<int> x;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  pair<nestl::impl::detail::rb_tree_node_base_*,_nestl::impl::detail::rb_tree_node_base_*> pVar2;
  iterator_with_flag iVar3;
  
  pVar2 = rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
          ::m_get_insert_unique_pos
                    ((rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
                      *)this,v);
  x.m_node = pVar2.first;
  if (pVar2.second == (base_ptr)0x0) {
    uVar1 = 0;
  }
  else {
    x.m_node = (base_ptr)
               m_insert_<nestl::has_exceptions::exception_ptr_error,int>
                         (this,err,x.m_node,pVar2.second,v);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  iVar3._8_8_ = uVar1;
  iVar3.first.m_node = x.m_node;
  return iVar3;
}

Assistant:

typename rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::iterator_with_flag
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_insert_unique(OperationError& err, Arg&& v) NESTL_NOEXCEPT_SPEC
{
    std::pair<base_ptr, base_ptr> res = m_get_insert_unique_pos(KeyOfValue()(v));

    if (res.second)
    {
        iterator pos = m_insert_(err, res.first, res.second, std::forward<Arg>(v));
        // NOTE: we return unconditionally, even in case of error
        return {pos, true};
    }

    return {iterator(static_cast<link_type>(res.first)), false};
}